

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClusterList.h
# Opt level: O2

uint __thiscall
SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u>::Lookup<true,false>
          (SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u> *this,uint index)

{
  long lVar1;
  uint uVar2;
  
  if (index < *(uint *)this) {
    lVar1 = *(long *)(*(long *)(this + 8) + (ulong)(index >> 4) * 8);
    if (lVar1 != 0) {
      uVar2 = *(uint *)(lVar1 + (ulong)(index & 0xf) * 4);
      if (uVar2 == index) {
        return index;
      }
      uVar2 = Lookup<false,false>(this,uVar2);
      *(uint *)(*(long *)(*(long *)(this + 8) + (ulong)(index >> 4) * 8) + (ulong)(index & 0xf) * 4)
           = uVar2;
      return uVar2;
    }
  }
  SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U>::CreateBacking
            ((SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *)this,index);
  return index;
}

Assistant:

inline indexType Lookup(indexType index)
    {
        if (index >= maxIndex || backingStore[index / numPerSegment] == nullptr)
        {
            // Not being there simply means that it's still an identity mapping
            if(createBacking)
            {
                CreateBacking(index);
            }
            return index;
        }
        if (assumeConsolidated)
        {
            // If the list is consolidated, then we can return whatever's there
            return backingStore[index / numPerSegment][index % numPerSegment];
        }
        else
        {
            // If it's not consolidated, we need to follow the chain down, and update each entry to the root
            indexType currentValue = backingStore[index / numPerSegment][index % numPerSegment];
            if (currentValue == index)
            {
                return index;
            }
            indexType trueRoot = Lookup<false, assumeConsolidated>(currentValue);
            backingStore[index / numPerSegment][index % numPerSegment] = trueRoot;
            return trueRoot;
        }
    }